

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O0

void __thiscall
Atari::ST::ConcreteMachine::set_component_prefers_clocking
          (ConcreteMachine *this,Source *param_1,Preference param_2)

{
  Preference PVar1;
  ACIA *pAVar2;
  MFP68901 *this_00;
  DMAController *this_01;
  bool local_1d;
  Preference param_2_local;
  Source *param_1_local;
  ConcreteMachine *this_local;
  
  pAVar2 = JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::last_valid
                     (&this->keyboard_acia_);
  PVar1 = Motorola::ACIA::ACIA::preferred_clocking(pAVar2);
  local_1d = false;
  if (PVar1 != RealTime) {
    pAVar2 = JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::last_valid(&this->midi_acia_)
    ;
    PVar1 = Motorola::ACIA::ACIA::preferred_clocking(pAVar2);
    local_1d = PVar1 != RealTime;
  }
  this->may_defer_acias_ = local_1d;
  PVar1 = IntelligentKeyboard::preferred_clocking(&this->ikbd_);
  this->keyboard_needs_clock_ = PVar1 != None;
  this_00 = JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::last_valid
                      (&this->mfp_);
  PVar1 = Motorola::MFP68901::MFP68901::preferred_clocking(this_00);
  this->mfp_is_realtime_ = PVar1 == RealTime;
  this_01 = JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::last_valid(&this->dma_);
  PVar1 = DMAController::preferred_clocking(this_01);
  this->dma_clocking_preference_ = PVar1;
  return;
}

Assistant:

void set_component_prefers_clocking(ClockingHint::Source *, ClockingHint::Preference) final {
			// This is being called by one of the components; avoid any time flushing here as that's
			// already dealt with (and, just to be absolutely sure, to avoid recursive mania).
			may_defer_acias_ =
				(keyboard_acia_.last_valid()->preferred_clocking() != ClockingHint::Preference::RealTime) &&
				(midi_acia_.last_valid()->preferred_clocking() != ClockingHint::Preference::RealTime);
			keyboard_needs_clock_ = ikbd_.preferred_clocking() != ClockingHint::Preference::None;
			mfp_is_realtime_ = mfp_.last_valid()->preferred_clocking() == ClockingHint::Preference::RealTime;
			dma_clocking_preference_ = dma_.last_valid()->preferred_clocking();
		}